

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar_v7tar.c
# Opt level: O2

void test_write_format_tar_v7tar(void)

{
  int iVar1;
  wchar_t wVar2;
  char *p;
  archive *_a;
  archive_entry *paVar3;
  la_ssize_t lVar4;
  char cVar5;
  long lVar6;
  size_t used;
  char f99 [100];
  char f100 [101];
  
  cVar5 = 'a';
  for (lVar6 = 0; lVar6 != 99; lVar6 = lVar6 + 1) {
    f99[lVar6] = cVar5 + (char)(((ushort)lVar6 & 0xff) / 0x1a) * -0x1a;
    cVar5 = cVar5 + '\x01';
  }
  f99[99] = '\0';
  cVar5 = 'A';
  for (lVar6 = 0; lVar6 != 100; lVar6 = lVar6 + 1) {
    f100[lVar6] = cVar5 + (char)(((ushort)lVar6 & 0xff) / 0x1a) * -0x1a;
    cVar5 = cVar5 + '\x01';
  }
  f100[100] = '\0';
  p = (char *)malloc(100000);
  _a = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'H',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_v7tar(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'J',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_v7tar(a)",_a);
  iVar1 = archive_write_add_filter_none(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'L',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",_a);
  iVar1 = archive_write_open_memory(_a,p,100000,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'N',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used)",_a);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'V',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_set_pathname(paVar3,"file");
  archive_entry_set_mode(paVar3,0x81b4);
  archive_entry_set_size(paVar3,10);
  archive_entry_set_uid(paVar3,0x50);
  archive_entry_set_gid(paVar3,0x5a);
  archive_entry_set_dev(paVar3,0xc);
  archive_entry_set_ino(paVar3,0x59);
  archive_entry_set_nlink(paVar3,2);
  iVar1 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'`',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'b',10,"10",lVar4,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'e',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_set_pathname(paVar3,"linkfile");
  archive_entry_set_hardlink(paVar3,"file");
  archive_entry_set_mode(paVar3,0x81b4);
  archive_entry_set_size(paVar3,10);
  archive_entry_set_uid(paVar3,0x50);
  archive_entry_set_gid(paVar3,0x5a);
  archive_entry_set_dev(paVar3,0xc);
  archive_entry_set_ino(paVar3,0x59);
  archive_entry_set_nlink(paVar3,2);
  iVar1 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'p',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L's',0,"0",lVar4,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'v',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,2,0x14);
  archive_entry_set_pathname(paVar3,"dir");
  archive_entry_set_mode(paVar3,0x41fd);
  archive_entry_set_size(paVar3,10);
  archive_entry_set_nlink(paVar3,2);
  iVar1 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'|',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  lVar4 = archive_write_data(_a,"1234567890",10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'\x7f',0,"0",lVar4,"archive_write_data(a, \"1234567890\", 10)",_a);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'\x82',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,3,0x1e);
  archive_entry_set_pathname(paVar3,"symlink");
  archive_entry_set_mode(paVar3,0x1b4);
  archive_entry_set_filetype(paVar3,0xa000);
  archive_entry_set_symlink(paVar3,"file");
  archive_entry_set_size(paVar3,0);
  archive_entry_set_uid(paVar3,0x58);
  archive_entry_set_gid(paVar3,0x62);
  archive_entry_set_dev(paVar3,0xc);
  archive_entry_set_ino(paVar3,0x5a);
  archive_entry_set_nlink(paVar3,1);
  iVar1 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'\x8e',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'\x92',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_set_pathname(paVar3,f99);
  archive_entry_set_mode(paVar3,0x81b4);
  archive_entry_set_size(paVar3,0);
  archive_entry_set_uid(paVar3,0x52);
  archive_entry_set_gid(paVar3,0x5d);
  archive_entry_set_dev(paVar3,0x66);
  archive_entry_set_ino(paVar3,7);
  archive_entry_set_nlink(paVar3,1);
  iVar1 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'\x9c',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",_a);
  archive_entry_free(paVar3);
  paVar3 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'\xa0',(uint)(paVar3 != (archive_entry *)0x0),
                   "(entry = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar3,1,10);
  archive_entry_set_pathname(paVar3,f100);
  archive_entry_set_mode(paVar3,0x81b4);
  archive_entry_set_size(paVar3,0);
  archive_entry_set_uid(paVar3,0x52);
  archive_entry_set_gid(paVar3,0x5d);
  archive_entry_set_dev(paVar3,0x66);
  archive_entry_set_ino(paVar3,7);
  archive_entry_set_nlink(paVar3,1);
  failure("100-char filename should be rejected");
  iVar1 = archive_write_header(_a,paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'«',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, entry)",_a)
  ;
  archive_entry_free(paVar3);
  iVar1 = archive_write_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¯',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'·',p,"e + 0","file","\"file\"",5,"5",(void *)0x0);
  p[4] = '\0';
  p[0] = '\0';
  p[1] = '\0';
  p[2] = '\0';
  p[3] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¸',p + 100,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  p[100] = '\0';
  p[0x65] = '\0';
  p[0x66] = '\0';
  p[0x67] = '\0';
  p[0x68] = '\0';
  p[0x69] = '\0';
  p[0x6a] = '\0';
  p[0x6b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¹',p + 0x6c,"e + 108","000120 ","\"000120 \"",8,"8",(void *)0x0);
  p[0x6c] = '\0';
  p[0x6d] = '\0';
  p[0x6e] = '\0';
  p[0x6f] = '\0';
  p[0x70] = '\0';
  p[0x71] = '\0';
  p[0x72] = '\0';
  p[0x73] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'º',p + 0x74,"e + 116","000132 ","\"000132 \"",8,"8",(void *)0x0);
  p[0x74] = '\0';
  p[0x75] = '\0';
  p[0x76] = '\0';
  p[0x77] = '\0';
  p[0x78] = '\0';
  p[0x79] = '\0';
  p[0x7a] = '\0';
  p[0x7b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'»',p + 0x7c,"e + 124","00000000012 ","\"00000000012 \"",0xc,"12",
                      (void *)0x0);
  p[0x7c] = '\0';
  p[0x7d] = '\0';
  p[0x7e] = '\0';
  p[0x7f] = '\0';
  p[0x80] = '\0';
  p[0x81] = '\0';
  p[0x82] = '\0';
  p[0x83] = '\0';
  p[0x84] = '\0';
  p[0x85] = '\0';
  p[0x86] = '\0';
  p[0x87] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¼',p + 0x88,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  p[0x88] = '\0';
  p[0x89] = '\0';
  p[0x8a] = '\0';
  p[0x8b] = '\0';
  p[0x8c] = '\0';
  p[0x8d] = '\0';
  p[0x8e] = '\0';
  p[0x8f] = '\0';
  p[0x90] = '\0';
  p[0x91] = '\0';
  p[0x92] = '\0';
  p[0x93] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'½',p + 0x94,"e + 148","005335","\"005335\\0 \"",8,"8",(void *)0x0);
  p[0x94] = '\0';
  p[0x95] = '\0';
  p[0x96] = '\0';
  p[0x97] = '\0';
  p[0x98] = '\0';
  p[0x99] = '\0';
  p[0x9a] = '\0';
  p[0x9b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¾',p + 0x9c,"e + 156","","\"\"",1,"1",(void *)0x0);
  p[0x9c] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'¿',p + 0x9d,"e + 157","","\"\"",1,"1",(void *)0x0);
  p[0x9d] = '\0';
  wVar2 = is_null(p,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'À',wVar2,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Á',p + 0x200,"e + 512","1234567890","\"1234567890\"",10,"10",(void *)0x0);
  p[0x200] = '\0';
  p[0x201] = '\0';
  p[0x202] = '\0';
  p[0x203] = '\0';
  p[0x204] = '\0';
  p[0x205] = '\0';
  p[0x206] = '\0';
  p[0x207] = '\0';
  p[0x208] = '\0';
  p[0x209] = '\0';
  wVar2 = is_null(p + 0x200,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'Â',wVar2,"is_null(e + 512, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Æ',p + 0x400,"e + 0","linkfile","\"linkfile\"",9,"9",(void *)0x0);
  p[0x408] = '\0';
  p[0x400] = '\0';
  p[0x401] = '\0';
  p[0x402] = '\0';
  p[0x403] = '\0';
  p[0x404] = '\0';
  p[0x405] = '\0';
  p[0x406] = '\0';
  p[0x407] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ç',p + 0x464,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  p[0x464] = '\0';
  p[0x465] = '\0';
  p[0x466] = '\0';
  p[0x467] = '\0';
  p[0x468] = '\0';
  p[0x469] = '\0';
  p[0x46a] = '\0';
  p[0x46b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'È',p + 0x46c,"e + 108","000120 ","\"000120 \"",8,"8",(void *)0x0);
  p[0x46c] = '\0';
  p[0x46d] = '\0';
  p[0x46e] = '\0';
  p[0x46f] = '\0';
  p[0x470] = '\0';
  p[0x471] = '\0';
  p[0x472] = '\0';
  p[0x473] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'É',p + 0x474,"e + 116","000132 ","\"000132 \"",8,"8",(void *)0x0);
  p[0x474] = '\0';
  p[0x475] = '\0';
  p[0x476] = '\0';
  p[0x477] = '\0';
  p[0x478] = '\0';
  p[0x479] = '\0';
  p[0x47a] = '\0';
  p[0x47b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ê',p + 0x47c,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  p[0x47c] = '\0';
  p[0x47d] = '\0';
  p[0x47e] = '\0';
  p[0x47f] = '\0';
  p[0x480] = '\0';
  p[0x481] = '\0';
  p[0x482] = '\0';
  p[0x483] = '\0';
  p[0x484] = '\0';
  p[0x485] = '\0';
  p[0x486] = '\0';
  p[0x487] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ë',p + 0x488,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  p[0x488] = '\0';
  p[0x489] = '\0';
  p[0x48a] = '\0';
  p[0x48b] = '\0';
  p[0x48c] = '\0';
  p[0x48d] = '\0';
  p[0x48e] = '\0';
  p[0x48f] = '\0';
  p[0x490] = '\0';
  p[0x491] = '\0';
  p[0x492] = '\0';
  p[0x493] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ì',p + 0x494,"e + 148","007131","\"007131\\0 \"",8,"8",(void *)0x0);
  p[0x494] = '\0';
  p[0x495] = '\0';
  p[0x496] = '\0';
  p[0x497] = '\0';
  p[0x498] = '\0';
  p[0x499] = '\0';
  p[0x49a] = '\0';
  p[0x49b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Í',p + 0x49c,"e + 156","1","\"1\"",1,"1",(void *)0x0);
  p[0x49c] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Î',p + 0x49d,"e + 157","file","\"file\"",5,"5",(void *)0x0);
  p[0x4a1] = '\0';
  p[0x49d] = '\0';
  p[0x49e] = '\0';
  p[0x49f] = '\0';
  p[0x4a0] = '\0';
  wVar2 = is_null(p + 0x400,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'Ï',wVar2,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ó',p + 0x600,"e + 0","dir/","\"dir/\"",4,"4",(void *)0x0);
  p[0x600] = '\0';
  p[0x601] = '\0';
  p[0x602] = '\0';
  p[0x603] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ô',p + 0x664,"e + 100","000775 ","\"000775 \"",8,"8",(void *)0x0);
  p[0x664] = '\0';
  p[0x665] = '\0';
  p[0x666] = '\0';
  p[0x667] = '\0';
  p[0x668] = '\0';
  p[0x669] = '\0';
  p[0x66a] = '\0';
  p[0x66b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Õ',p + 0x66c,"e + 108","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0x66c] = '\0';
  p[0x66d] = '\0';
  p[0x66e] = '\0';
  p[0x66f] = '\0';
  p[0x670] = '\0';
  p[0x671] = '\0';
  p[0x672] = '\0';
  p[0x673] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ö',p + 0x674,"e + 116","000000 ","\"000000 \"",8,"8",(void *)0x0);
  p[0x674] = '\0';
  p[0x675] = '\0';
  p[0x676] = '\0';
  p[0x677] = '\0';
  p[0x678] = '\0';
  p[0x679] = '\0';
  p[0x67a] = '\0';
  p[0x67b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'×',p + 0x67c,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  p[0x67c] = '\0';
  p[0x67d] = '\0';
  p[0x67e] = '\0';
  p[0x67f] = '\0';
  p[0x680] = '\0';
  p[0x681] = '\0';
  p[0x682] = '\0';
  p[0x683] = '\0';
  p[0x684] = '\0';
  p[0x685] = '\0';
  p[0x686] = '\0';
  p[0x687] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ø',p + 0x688,"e + 136","00000000002 ","\"00000000002 \"",0xc,"12",
                      (void *)0x0);
  p[0x688] = '\0';
  p[0x689] = '\0';
  p[0x68a] = '\0';
  p[0x68b] = '\0';
  p[0x68c] = '\0';
  p[0x68d] = '\0';
  p[0x68e] = '\0';
  p[0x68f] = '\0';
  p[0x690] = '\0';
  p[0x691] = '\0';
  p[0x692] = '\0';
  p[0x693] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ù',p + 0x694,"e + 148","005243","\"005243\\0 \"",8,"8",(void *)0x0);
  p[0x694] = '\0';
  p[0x695] = '\0';
  p[0x696] = '\0';
  p[0x697] = '\0';
  p[0x698] = '\0';
  p[0x699] = '\0';
  p[0x69a] = '\0';
  p[0x69b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Ú',p + 0x69c,"e + 156","","\"\"",1,"1",(void *)0x0);
  p[0x69c] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'Û',p + 0x69d,"e + 157","","\"\"",1,"1",(void *)0x0);
  p[0x69d] = '\0';
  wVar2 = is_null(p + 0x600,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'Ü',wVar2,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'à',p + 0x800,"e + 0","symlink","\"symlink\"",8,"8",(void *)0x0);
  p[0x800] = '\0';
  p[0x801] = '\0';
  p[0x802] = '\0';
  p[0x803] = '\0';
  p[0x804] = '\0';
  p[0x805] = '\0';
  p[0x806] = '\0';
  p[0x807] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'á',p + 0x864,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  p[0x864] = '\0';
  p[0x865] = '\0';
  p[0x866] = '\0';
  p[0x867] = '\0';
  p[0x868] = '\0';
  p[0x869] = '\0';
  p[0x86a] = '\0';
  p[0x86b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'â',p + 0x86c,"e + 108","000130 ","\"000130 \"",8,"8",(void *)0x0);
  p[0x86c] = '\0';
  p[0x86d] = '\0';
  p[0x86e] = '\0';
  p[0x86f] = '\0';
  p[0x870] = '\0';
  p[0x871] = '\0';
  p[0x872] = '\0';
  p[0x873] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ã',p + 0x874,"e + 116","000142 ","\"000142 \"",8,"8",(void *)0x0);
  p[0x874] = '\0';
  p[0x875] = '\0';
  p[0x876] = '\0';
  p[0x877] = '\0';
  p[0x878] = '\0';
  p[0x879] = '\0';
  p[0x87a] = '\0';
  p[0x87b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ä',p + 0x87c,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  p[0x87c] = '\0';
  p[0x87d] = '\0';
  p[0x87e] = '\0';
  p[0x87f] = '\0';
  p[0x880] = '\0';
  p[0x881] = '\0';
  p[0x882] = '\0';
  p[0x883] = '\0';
  p[0x884] = '\0';
  p[0x885] = '\0';
  p[0x886] = '\0';
  p[0x887] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'å',p + 0x888,"e + 136","00000000003 ","\"00000000003 \"",0xc,"12",
                      (void *)0x0);
  p[0x888] = '\0';
  p[0x889] = '\0';
  p[0x88a] = '\0';
  p[0x88b] = '\0';
  p[0x88c] = '\0';
  p[0x88d] = '\0';
  p[0x88e] = '\0';
  p[0x88f] = '\0';
  p[0x890] = '\0';
  p[0x891] = '\0';
  p[0x892] = '\0';
  p[0x893] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'æ',p + 0x894,"e + 148","007027","\"007027\\0 \"",8,"8",(void *)0x0);
  p[0x894] = '\0';
  p[0x895] = '\0';
  p[0x896] = '\0';
  p[0x897] = '\0';
  p[0x898] = '\0';
  p[0x899] = '\0';
  p[0x89a] = '\0';
  p[0x89b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ç',p + 0x89c,"e + 156","2","\"2\"",1,"1",(void *)0x0);
  p[0x89c] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'è',p + 0x89d,"e + 157","file","\"file\"",5,"5",(void *)0x0);
  p[0x8a1] = '\0';
  p[0x89d] = '\0';
  p[0x89e] = '\0';
  p[0x89f] = '\0';
  p[0x8a0] = '\0';
  wVar2 = is_null(p + 0x800,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'é',wVar2,"is_null(e + 0, 512)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'í',p + 0xa00,"e + 0",f99,"f99",100,"100",(void *)0x0);
  p[0xa00] = '\0';
  p[0xa01] = '\0';
  p[0xa02] = '\0';
  p[0xa03] = '\0';
  p[0xa04] = '\0';
  p[0xa05] = '\0';
  p[0xa06] = '\0';
  p[0xa07] = '\0';
  p[0xa08] = '\0';
  p[0xa09] = '\0';
  p[0xa0a] = '\0';
  p[0xa0b] = '\0';
  p[0xa0c] = '\0';
  p[0xa0d] = '\0';
  p[0xa0e] = '\0';
  p[0xa0f] = '\0';
  p[0xa10] = '\0';
  p[0xa11] = '\0';
  p[0xa12] = '\0';
  p[0xa13] = '\0';
  p[0xa14] = '\0';
  p[0xa15] = '\0';
  p[0xa16] = '\0';
  p[0xa17] = '\0';
  p[0xa18] = '\0';
  p[0xa19] = '\0';
  p[0xa1a] = '\0';
  p[0xa1b] = '\0';
  p[0xa1c] = '\0';
  p[0xa1d] = '\0';
  p[0xa1e] = '\0';
  p[0xa1f] = '\0';
  p[0xa20] = '\0';
  p[0xa21] = '\0';
  p[0xa22] = '\0';
  p[0xa23] = '\0';
  p[0xa24] = '\0';
  p[0xa25] = '\0';
  p[0xa26] = '\0';
  p[0xa27] = '\0';
  p[0xa28] = '\0';
  p[0xa29] = '\0';
  p[0xa2a] = '\0';
  p[0xa2b] = '\0';
  p[0xa2c] = '\0';
  p[0xa2d] = '\0';
  p[0xa2e] = '\0';
  p[0xa2f] = '\0';
  p[0xa30] = '\0';
  p[0xa31] = '\0';
  p[0xa32] = '\0';
  p[0xa33] = '\0';
  p[0xa34] = '\0';
  p[0xa35] = '\0';
  p[0xa36] = '\0';
  p[0xa37] = '\0';
  p[0xa38] = '\0';
  p[0xa39] = '\0';
  p[0xa3a] = '\0';
  p[0xa3b] = '\0';
  p[0xa3c] = '\0';
  p[0xa3d] = '\0';
  p[0xa3e] = '\0';
  p[0xa3f] = '\0';
  p[0xa40] = '\0';
  p[0xa41] = '\0';
  p[0xa42] = '\0';
  p[0xa43] = '\0';
  p[0xa44] = '\0';
  p[0xa45] = '\0';
  p[0xa46] = '\0';
  p[0xa47] = '\0';
  p[0xa48] = '\0';
  p[0xa49] = '\0';
  p[0xa4a] = '\0';
  p[0xa4b] = '\0';
  p[0xa4c] = '\0';
  p[0xa4d] = '\0';
  p[0xa4e] = '\0';
  p[0xa4f] = '\0';
  p[0xa50] = '\0';
  p[0xa51] = '\0';
  p[0xa52] = '\0';
  p[0xa53] = '\0';
  p[0xa54] = '\0';
  p[0xa55] = '\0';
  p[0xa56] = '\0';
  p[0xa57] = '\0';
  p[0xa58] = '\0';
  p[0xa59] = '\0';
  p[0xa5a] = '\0';
  p[0xa5b] = '\0';
  p[0xa5c] = '\0';
  p[0xa5d] = '\0';
  p[0xa5e] = '\0';
  p[0xa5f] = '\0';
  p[0xa60] = '\0';
  p[0xa61] = '\0';
  p[0xa62] = '\0';
  p[0xa63] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'î',p + 0xa64,"e + 100","000664 ","\"000664 \"",8,"8",(void *)0x0);
  p[0xa64] = '\0';
  p[0xa65] = '\0';
  p[0xa66] = '\0';
  p[0xa67] = '\0';
  p[0xa68] = '\0';
  p[0xa69] = '\0';
  p[0xa6a] = '\0';
  p[0xa6b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ï',p + 0xa6c,"e + 108","000122 ","\"000122 \"",8,"8",(void *)0x0);
  p[0xa6c] = '\0';
  p[0xa6d] = '\0';
  p[0xa6e] = '\0';
  p[0xa6f] = '\0';
  p[0xa70] = '\0';
  p[0xa71] = '\0';
  p[0xa72] = '\0';
  p[0xa73] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ð',p + 0xa74,"e + 116","000135 ","\"000135 \"",8,"8",(void *)0x0);
  p[0xa74] = '\0';
  p[0xa75] = '\0';
  p[0xa76] = '\0';
  p[0xa77] = '\0';
  p[0xa78] = '\0';
  p[0xa79] = '\0';
  p[0xa7a] = '\0';
  p[0xa7b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ñ',p + 0xa7c,"e + 124","00000000000 ","\"00000000000 \"",0xc,"12",
                      (void *)0x0);
  p[0xa7c] = '\0';
  p[0xa7d] = '\0';
  p[0xa7e] = '\0';
  p[0xa7f] = '\0';
  p[0xa80] = '\0';
  p[0xa81] = '\0';
  p[0xa82] = '\0';
  p[0xa83] = '\0';
  p[0xa84] = '\0';
  p[0xa85] = '\0';
  p[0xa86] = '\0';
  p[0xa87] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ò',p + 0xa88,"e + 136","00000000001 ","\"00000000001 \"",0xc,"12",
                      (void *)0x0);
  p[0xa88] = '\0';
  p[0xa89] = '\0';
  p[0xa8a] = '\0';
  p[0xa8b] = '\0';
  p[0xa8c] = '\0';
  p[0xa8d] = '\0';
  p[0xa8e] = '\0';
  p[0xa8f] = '\0';
  p[0xa90] = '\0';
  p[0xa91] = '\0';
  p[0xa92] = '\0';
  p[0xa93] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ó',p + 0xa94,"e + 148","031543","\"031543\\0 \"",8,"8",(void *)0x0);
  p[0xa94] = '\0';
  p[0xa95] = '\0';
  p[0xa96] = '\0';
  p[0xa97] = '\0';
  p[0xa98] = '\0';
  p[0xa99] = '\0';
  p[0xa9a] = '\0';
  p[0xa9b] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ô',p + 0xa9c,"e + 156","","\"\"",1,"1",(void *)0x0);
  p[0xa9c] = '\0';
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'õ',p + 0xa9d,"e + 157","","\"\"",1,"1",(void *)0x0);
  p[0xa9d] = '\0';
  wVar2 = is_null(p + 0xa00,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'ö',wVar2,"is_null(e + 0, 512)",(void *)0x0);
  wVar2 = is_null(p + 0xc00,0x400);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                   ,L'ü',wVar2,"is_null(e, 1024)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_tar_v7tar.c"
                      ,L'ÿ',(long)(int)used,"(int)used",0x1000,"e - buff",(void *)0x0);
  free(p);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_tar_v7tar)
{
	struct archive *a;
	struct archive_entry *entry;
	char *buff, *e;
	size_t buffsize = 100000;
	size_t used;
	int i;
	char f99[100];
	char f100[101];

	for (i = 0; i < 99; ++i)
		f99[i] = 'a' + i % 26;
	f99[99] = '\0';

	for (i = 0; i < 100; ++i)
		f100[i] = 'A' + i % 26;
	f100[100] = '\0';

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_format_v7tar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Add various files to it.
	 * TODO: Extend this to cover more filetypes.
	 */

	/* "file" with 10 bytes of content */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, "file");
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 10);
	archive_entry_set_uid(entry, 80);
	archive_entry_set_gid(entry, 90);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 89);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualIntA(a, 10, archive_write_data(a, "1234567890", 10));

	/* Hardlink to "file" with 10 bytes of content */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, "linkfile");
	archive_entry_set_hardlink(entry, "file");
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 10);
	archive_entry_set_uid(entry, 80);
	archive_entry_set_gid(entry, 90);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 89);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to dir should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* "dir" */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 2, 20);
	archive_entry_set_pathname(entry, "dir");
	archive_entry_set_mode(entry, S_IFDIR | 0775);
	archive_entry_set_size(entry, 10);
	archive_entry_set_nlink(entry, 2);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	/* Write of data to dir should fail == zero bytes get written. */
	assertEqualIntA(a, 0, archive_write_data(a, "1234567890", 10));

	/* "symlink" pointing to "file" */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 3, 30);
	archive_entry_set_pathname(entry, "symlink");
	archive_entry_set_mode(entry, 0664);
	archive_entry_set_filetype(entry, AE_IFLNK);
	archive_entry_set_symlink(entry,"file");
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 88);
	archive_entry_set_gid(entry, 98);
	archive_entry_set_dev(entry, 12);
	archive_entry_set_ino(entry, 90);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);

	/* file with 99-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f99);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);

	/* file with 100-char filename. */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_mtime(entry, 1, 10);
	archive_entry_set_pathname(entry, f100);
	archive_entry_set_mode(entry, S_IFREG | 0664);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, 82);
	archive_entry_set_gid(entry, 93);
	archive_entry_set_dev(entry, 102);
	archive_entry_set_ino(entry, 7);
	archive_entry_set_nlink(entry, 1);
	failure("100-char filename should be rejected");
	assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, entry));
	archive_entry_free(entry);

	/* Close out the archive. */
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Verify the archive format.
	 */
	e = buff;

	/* "file" */
	myAssertEqualMem(e + 0, "file", 5); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000120 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000132 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000012 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "005335\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	assert(is_null(e + 0, 512));
	myAssertEqualMem(e + 512, "1234567890", 10);
	assert(is_null(e + 512, 512));
	e += 1024;

	/* hardlink to "file" */
	myAssertEqualMem(e + 0, "linkfile", 9); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000120 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000132 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "007131\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "1", 1); /* linkflag */
	myAssertEqualMem(e + 157, "file", 5); /* linkname */
	assert(is_null(e + 0, 512));
	e += 512;

	/* "dir" */
	myAssertEqualMem(e + 0, "dir/", 4); /* Filename */
	myAssertEqualMem(e + 100, "000775 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000000 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000000 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000002 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "005243\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "", 1); /* typeflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	assert(is_null(e + 0, 512));
	e += 512;

	/* "symlink" pointing to "file" */
	myAssertEqualMem(e + 0, "symlink", 8); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000130 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000142 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000003 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "007027\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "2", 1); /* linkflag */
	myAssertEqualMem(e + 157, "file", 5); /* linkname */
	assert(is_null(e + 0, 512));
	e += 512;

	/* File with 99-char filename */
	myAssertEqualMem(e + 0, f99, 100); /* Filename */
	myAssertEqualMem(e + 100, "000664 ", 8); /* mode */
	myAssertEqualMem(e + 108, "000122 ", 8); /* uid */
	myAssertEqualMem(e + 116, "000135 ", 8); /* gid */
	myAssertEqualMem(e + 124, "00000000000 ", 12); /* size */
	myAssertEqualMem(e + 136, "00000000001 ", 12); /* mtime */
	myAssertEqualMem(e + 148, "031543\0 ", 8); /* checksum */
	myAssertEqualMem(e + 156, "", 1); /* linkflag */
	myAssertEqualMem(e + 157, "", 1); /* linkname */
	assert(is_null(e + 0, 512));
	e += 512;

	/* TODO: Verify other types of entries. */

	/* Last entry is end-of-archive marker. */
	assert(is_null(e, 1024));
	e += 1024;

	assertEqualInt((int)used, e - buff);

	free(buff);
}